

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mnemonic.c
# Opt level: O2

char * mnemonic_from_bytes(words *w,uchar *bytes,size_t bytes_len)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  char *pcVar7;
  char *__dest;
  size_t size;
  
  sVar5 = w->bits;
  size = 0;
  uVar1 = (bytes_len * 8) / sVar5;
  for (uVar6 = 0; uVar6 < uVar1; uVar6 = uVar6 + 1) {
    sVar2 = extract_index(sVar5,bytes,uVar6);
    sVar3 = strlen(w->indices[sVar2]);
    size = size + sVar3 + 1;
  }
  if ((size != 0) && (pcVar4 = (char *)wally_malloc(size), pcVar4 != (char *)0x0)) {
    __dest = pcVar4;
    for (uVar6 = 0; uVar6 < uVar1; uVar6 = uVar6 + 1) {
      sVar5 = extract_index(w->bits,bytes,uVar6);
      pcVar7 = w->indices[sVar5];
      sVar3 = strlen(pcVar7);
      memcpy(__dest,pcVar7,sVar3);
      pcVar7 = __dest + sVar3;
      __dest = pcVar7 + 1;
      *pcVar7 = ' ';
    }
    pcVar4[size - 1] = '\0';
    return pcVar4;
  }
  return (char *)0x0;
}

Assistant:

char *mnemonic_from_bytes(const struct words *w, const unsigned char *bytes, size_t bytes_len)
{
    size_t total_bits = bytes_len * 8u; /* bits in 'bytes' */
    size_t total_mnemonics = total_bits / w->bits; /* Mnemonics in 'bytes' */
    size_t i, str_len = 0;
    char *str = NULL;

    /* Compute length of result */
    for (i = 0; i < total_mnemonics; ++i) {
        size_t idx = extract_index(w->bits, bytes, i);
        size_t mnemonic_len = strlen(w->indices[idx]);

        str_len += mnemonic_len + 1; /* +1 for following separator or NUL */
    }

    /* Allocate and fill result */
    if (str_len && (str = wally_malloc(str_len))) {
        char *out = str;

        for (i = 0; i < total_mnemonics; ++i) {
            size_t idx = extract_index(w->bits, bytes, i);
            size_t mnemonic_len = strlen(w->indices[idx]);

            memcpy(out, w->indices[idx], mnemonic_len);
            out[mnemonic_len] = ' '; /* separator */
            out += mnemonic_len + 1;
        }
        str[str_len - 1] = '\0'; /* Overwrite the last separator with NUL */
    }

    return str;
}